

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt_bcast.c
# Opt level: O0

clnt_stat rpc_broadcast_exp(rpcprog_t prog,rpcvers_t vers,rpcproc_t proc,xdrproc_t xargs,void *argsp
                           ,xdrproc_t xresults,void *resultsp,resultproc_t eachresult,int inittime,
                           int waittime,char *nettype)

{
  clnt_stat cVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  _Bool _Var5;
  uint16_t uVar6;
  u_int uVar7;
  int iVar8;
  uint uVar9;
  AUTH *auth;
  void *vhandle;
  ulong __n;
  ulong uVar10;
  size_t sVar11;
  ssize_t sVar12;
  int *piVar13;
  netbuf *p;
  undefined4 uStack_1b28;
  int refs_1;
  sockaddr_in sin;
  netbuf taddr;
  netbuf *np;
  _Bool local_1af1;
  _Bool done;
  void *addr;
  broadif *bip;
  int local_1ac8;
  __rpc_sockinfo si;
  int fd;
  int refs;
  clnt_stat stat;
  u_int maxbufsize;
  u_int udpbufsz;
  rmtcallres bres_pmap;
  rmtcallargs barg_pmap;
  char *outbuf_pmap;
  ulong uStack_1a60;
  int pmap_flag;
  size_t outlen_pmap;
  int i;
  int inlen;
  int fds_found;
  int pollretval;
  int msec;
  size_t outlen;
  r_rpcb_rmtcallres bres;
  r_rpcb_rmtcallargs barg;
  size_t fdlistno;
  pollfd pfd [20];
  anon_struct_176_8_b9f7f77a fdlist [20];
  int pmap_reply_flag;
  char *uaddrp;
  char uaddress [1024];
  netconfig *nconf;
  void *handle;
  AUTH *sys_auth;
  char *inbuf;
  char *outbuf;
  timespec ts;
  rpc_msg msg;
  XDR xdrs [1];
  xdrproc_t xresults_local;
  void *argsp_local;
  xdrproc_t xargs_local;
  rpcproc_t proc_local;
  rpcvers_t vers_local;
  rpcprog_t prog_local;
  
  inbuf = (char *)0x0;
  sys_auth = (AUTH *)0x0;
  auth = authunix_ncreate_default();
  barg.xdr_args = (xdrproc_t)0x0;
  uStack_1a60 = 0;
  bVar4 = false;
  barg_pmap.vers = 0;
  barg_pmap.proc = 0;
  stat = RPC_SUCCESS;
  refs = 0;
  cVar1 = (auth->ah_error).re_status;
  if (cVar1 != RPC_SUCCESS) {
    si.si_alen = auth_put(auth);
    if (si.si_alen == 0) {
      (*auth->ah_ops->ah_destroy)(auth);
    }
    if ((__ntirpc_pkg_params.debug_flags & 0x80) == 0) {
      return cVar1;
    }
    (*__ntirpc_pkg_params.warnx_)
              ("%s: auth_put(), refs %d\n","rpc_broadcast_exp",(ulong)(uint)si.si_alen);
    return cVar1;
  }
  if (nettype == (char *)0x0) {
    nettype = "datagram_n";
  }
  vhandle = __rpc_setconf(nettype);
  fd = 0;
  if (vhandle == (void *)0x0) {
    fd = 0x11;
    goto LAB_0010c648;
  }
  while( true ) {
    uaddress._1016_8_ = __rpc_getconf(vhandle);
    if ((netconfig *)uaddress._1016_8_ == (netconfig *)0x0) break;
    if (((netconfig *)uaddress._1016_8_)->nc_semantics == 1) {
      if ((xdrproc_t)0x13 < barg.xdr_args) break;
      iVar8 = __rpc_nconf2sockinfo
                        ((netconfig *)uaddress._1016_8_,(__rpc_sockinfo *)((long)&bip + 4));
      if (iVar8 != 0) {
        fdlist[(long)barg.xdr_args].raddr.__ss_align = 0;
        fdlist[(long)barg.xdr_args].nal.tqh_first =
             (broadif *)&fdlist[(long)barg.xdr_args].raddr.__ss_align;
        iVar8 = __rpc_getbroadifs(bip._4_4_,local_1ac8,si.si_af,
                                  (broadlist_t *)&fdlist[(long)barg.xdr_args].raddr.__ss_align);
        if (iVar8 != 0) {
          si.si_socktype = socket(bip._4_4_,si.si_af,local_1ac8);
          if (si.si_socktype < 0) {
            fd = 3;
          }
          else {
            *(int *)((long)&fdlist[(long)(barg.xdr_args + -1)].nal.tqh_last + 4) = bip._4_4_;
            fdlist[(long)barg.xdr_args].fd = local_1ac8;
            *(int *)&fdlist[(long)(barg.xdr_args + -1)].nal.tqh_last = si.si_socktype;
            *(undefined8 *)&fdlist[(long)barg.xdr_args].proto = uaddress._1016_8_;
            uVar7 = __rpc_get_a_size(bip._4_4_);
            *(u_int *)&fdlist[(long)barg.xdr_args].nconf = uVar7;
            pfd[(long)(barg.xdr_args + -1)].events = 0xc3;
            *(int *)&fdlist[(long)(barg.xdr_args + -1)].nal.tqh_last = si.si_socktype;
            pfd[(long)(barg.xdr_args + -1)].fd = si.si_socktype;
            uVar7 = __rpc_get_t_size(bip._4_4_,local_1ac8,0);
            *(u_int *)((long)&fdlist[(long)barg.xdr_args].nconf + 4) = uVar7;
            if ((uint)refs <= *(uint *)((long)&fdlist[(long)barg.xdr_args].nconf + 4)) {
              refs = *(int *)((long)&fdlist[(long)barg.xdr_args].nconf + 4);
            }
            if ((bip._4_4_ == 2) && (local_1ac8 == 0x11)) {
              if (stat < *(clnt_stat *)((long)&fdlist[(long)barg.xdr_args].nconf + 4)) {
                stat = *(clnt_stat *)((long)&fdlist[(long)barg.xdr_args].nconf + 4);
              }
              bVar4 = true;
            }
            barg.xdr_args = barg.xdr_args + 1;
          }
        }
      }
    }
  }
  if (barg.xdr_args == (xdrproc_t)0x0) {
    if (fd == 0) {
      fd = 0x11;
    }
  }
  else if (refs == 0) {
    if (fd == 0) {
      fd = 3;
    }
  }
  else {
    sys_auth = (AUTH *)(*__ntirpc_pkg_params.malloc_)
                                 ((ulong)(uint)refs,
                                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/clnt_bcast.c"
                                  ,0x162,"rpc_broadcast_exp");
    inbuf = (char *)(*__ntirpc_pkg_params.malloc_)
                              ((ulong)(uint)refs,
                               "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/clnt_bcast.c"
                               ,0x163,"rpc_broadcast_exp");
    if ((sys_auth == (AUTH *)0x0) || ((int *)inbuf == (int *)0x0)) {
      fd = 0xc;
    }
    else {
      clock_gettime(6,(timespec *)&outbuf);
      uVar9 = getpid();
      ts.tv_nsec._0_4_ = uVar9 ^ (uint)outbuf ^ (uint)ts.tv_sec;
      ts.tv_nsec._4_4_ = 0;
      msg.rm_xid = 2;
      msg.rm_xdr.where._4_4_ = 100000;
      msg.rm_flags = 3;
      msg.cb_prog = 5;
      bres.results._0_8_ = resultsp;
      outlen = (size_t)&uaddrp;
      bres.results.results_val = (char *)xresults;
      bres.xdr_res._0_4_ = prog;
      bres.xdr_res._4_4_ = vers;
      memcpy(&msg.cb_vers,&auth->ah_cred,0x198);
      memcpy(msg.cb_cred.oa_body + 0x188,&auth->ah_verf,0x198);
      xdrmem_ncreate((XDR *)(msg.rq_cred_body + 0x188),inbuf,refs,XDR_ENCODE);
      _Var5 = xdr_ncallmsg((XDR *)(msg.rq_cred_body + 0x188),(rpc_msg *)&ts.tv_nsec);
      if ((_Var5) &&
         (_Var5 = xdr_rpcb_rmtcallargs
                            ((XDR *)(msg.rq_cred_body + 0x188),(rpcb_rmtcallargs *)&bres.xdr_res),
         _Var5)) {
        uVar9 = (**(code **)(msg.rq_cred_body._392_8_ + 0x20))(msg.rq_cred_body + 0x188);
        __n = (ulong)uVar9;
        if (*(long *)(msg.rq_cred_body._392_8_ + 0x30) != 0) {
          (**(code **)(msg.rq_cred_body._392_8_ + 0x30))(msg.rq_cred_body + 0x188);
        }
        if (bVar4) {
          barg_pmap._24_8_ =
               (*__ntirpc_pkg_params.malloc_)
                         ((ulong)stat,
                          "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/clnt_bcast.c"
                          ,0x189,"rpc_broadcast_exp");
          if ((char *)barg_pmap._24_8_ == (char *)0x0) {
            fd = 0xc;
          }
          else {
            ts.tv_nsec._0_4_ = (uint)ts.tv_nsec + 1;
            msg.rm_xdr.where._4_4_ = 100000;
            msg.rm_flags = 2;
            msg.cb_prog = 5;
            bres_pmap.xdr_results = (xdrproc_t)resultsp;
            _maxbufsize = xresults;
            bres_pmap._16_8_ = xargs;
            xdrmem_ncreate((XDR *)(msg.rq_cred_body + 0x188),(char *)barg_pmap._24_8_,stat,
                           XDR_ENCODE);
            _Var5 = xdr_ncallmsg((XDR *)(msg.rq_cred_body + 0x188),(rpc_msg *)&ts.tv_nsec);
            if ((_Var5) &&
               (uVar9 = xdr_rmtcall_args((XDR *)(msg.rq_cred_body + 0x188),
                                         (rmtcallargs *)&bres_pmap.resultslen), (uVar9 & 1) != 0)) {
              uVar9 = (**(code **)(msg.rq_cred_body._392_8_ + 0x20))(msg.rq_cred_body + 0x188);
              uStack_1a60 = (ulong)uVar9;
              if (*(long *)(msg.rq_cred_body._392_8_ + 0x30) != 0) {
                (**(code **)(msg.rq_cred_body._392_8_ + 0x30))(msg.rq_cred_body + 0x188);
              }
              goto LAB_0010bd76;
            }
            fd = 1;
          }
        }
        else {
LAB_0010bd76:
          for (fds_found = inittime; fds_found <= waittime; fds_found = fds_found * 2) {
            for (outlen_pmap._4_4_ = 0; (xdrproc_t)(long)outlen_pmap._4_4_ < barg.xdr_args;
                outlen_pmap._4_4_ = outlen_pmap._4_4_ + 1) {
              if (*(uint *)((long)&fdlist[outlen_pmap._4_4_].nconf + 4) < __n) {
                fd = 3;
              }
              else {
                for (addr = (void *)fdlist[outlen_pmap._4_4_].raddr.__ss_align; addr != (void *)0x0;
                    addr = *(void **)((long)addr + 0x88)) {
                  __rpc_broadenable(*(int *)((long)&fdlist[(long)outlen_pmap._4_4_ + -1].nal.
                                                    tqh_last + 4),
                                    *(int *)&fdlist[(long)outlen_pmap._4_4_ + -1].nal.tqh_last,
                                    (broadif *)addr);
                  if ((__rpc_lowvers == 0) &&
                     (uVar10 = sendto(*(int *)&fdlist[(long)outlen_pmap._4_4_ + -1].nal.tqh_last,
                                      inbuf,__n,0,(sockaddr *)((long)addr + 8),
                                      *(socklen_t *)&fdlist[outlen_pmap._4_4_].nconf), uVar10 != __n
                     )) {
                    if ((__ntirpc_pkg_params.debug_flags & 0x1000) != 0) {
                      (*__ntirpc_pkg_params.warnx_)("clnt_bcast: cannot send broadcast packet");
                    }
                    fd = 3;
                  }
                  else if ((bVar4) &&
                          ((fdlist[outlen_pmap._4_4_].fd == 0x11 &&
                           (sVar11 = sendto(*(int *)&fdlist[(long)outlen_pmap._4_4_ + -1].nal.
                                                     tqh_last,(void *)barg_pmap._24_8_,uStack_1a60,0
                                            ,(sockaddr *)((long)addr + 8),
                                            *(socklen_t *)&fdlist[outlen_pmap._4_4_].nconf),
                           sVar11 != uStack_1a60)))) {
                    if ((__ntirpc_pkg_params.debug_flags & 0x1000) != 0) {
                      (*__ntirpc_pkg_params.warnx_)("clnt_bcast: Cannot send broadcast packet");
                    }
                    fd = 3;
                  }
                }
              }
            }
            if (eachresult == (resultproc_t)0x0) {
              fd = 0;
              break;
            }
LAB_0010c038:
            do {
              iVar8 = poll((pollfd *)&fdlistno,(nfds_t)barg.xdr_args,fds_found);
            } while (iVar8 == -1);
            if (iVar8 == 0) {
              fd = 5;
            }
            else {
              i = 0;
              for (outlen_pmap._4_4_ = 0;
                  (xdrproc_t)(long)outlen_pmap._4_4_ < barg.xdr_args && i < iVar8;
                  outlen_pmap._4_4_ = outlen_pmap._4_4_ + 1) {
                local_1af1 = false;
                if (pfd[(long)outlen_pmap._4_4_ + -1].revents != 0) {
                  if ((pfd[(long)outlen_pmap._4_4_ + -1].revents & 0x20U) == 0) {
                    i = i + 1;
                    do {
                      sVar12 = recvfrom(*(int *)&fdlist[(long)outlen_pmap._4_4_ + -1].nal.tqh_last,
                                        sys_auth,(ulong)*(uint *)((long)&fdlist[outlen_pmap._4_4_].
                                                                         nconf + 4),0,
                                        (sockaddr *)&fdlist[outlen_pmap._4_4_].asize,
                                        (socklen_t *)&fdlist[outlen_pmap._4_4_].nconf);
                      uVar9 = (uint)sVar12;
                      if (-1 < (int)uVar9) {
                        if (uVar9 < 4) goto LAB_0010c54f;
                        if (*(int *)&sys_auth->ah_ops == *(int *)inbuf) {
                          fdlist[0x13].nal.tqh_last._4_4_ = 0;
                          memcpy((void *)((long)&msg.ru.RM_rmb.ru + 0x10),&_null_auth,0x198);
                          msg.ru.RM_rmb.ru._8_8_ = &outlen;
                          msg.ru.RM_rmb.ru._0_8_ = xdr_rpcb_rmtcallres;
                        }
                        else {
                          if ((!bVar4) || (*(int *)&sys_auth->ah_ops != *(int *)barg_pmap._24_8_))
                          goto LAB_0010c54f;
                          fdlist[0x13].nal.tqh_last._4_4_ = 1;
                          memcpy((void *)((long)&msg.ru.RM_rmb.ru + 0x10),&_null_auth,0x198);
                          msg.ru.RM_rmb.ru._8_8_ = &maxbufsize;
                          msg.ru.RM_rmb.ru._0_8_ = xdr_rmtcallres;
                        }
                        xdrmem_ncreate((XDR *)(msg.rq_cred_body + 0x188),(char *)sys_auth,uVar9,
                                       XDR_DECODE);
                        _Var5 = xdr_nreplymsg((XDR *)(msg.rq_cred_body + 0x188),
                                              (rpc_msg *)&ts.tv_nsec);
                        if (((_Var5) && (msg.ru.RM_cmb.cb_rpcvers == 0)) &&
                           (msg.ru.RM_rmb.rp_stat == MSG_ACCEPTED)) {
                          if ((bVar4) && (fdlist[0x13].nal.tqh_last._4_4_ != 0)) {
                            uVar2 = fdlist[outlen_pmap._4_4_].asize;
                            uVar3 = fdlist[outlen_pmap._4_4_].dsize;
                            sin._0_8_ = *(undefined8 *)&fdlist[outlen_pmap._4_4_].raddr;
                            uVar6 = htons((uint16_t)bres_pmap.results_ptr._4_4_);
                            uStack_1b28 = CONCAT22(uVar6,(short)uVar2);
                            fdlist[outlen_pmap._4_4_].asize = uStack_1b28;
                            fdlist[outlen_pmap._4_4_].dsize = uVar3;
                            *(undefined8 *)&fdlist[outlen_pmap._4_4_].raddr = sin._0_8_;
                            sin.sin_zero[0] = 0x80;
                            sin.sin_zero[1] = '\0';
                            sin.sin_zero[2] = '\0';
                            sin.sin_zero[3] = '\0';
                            sin.sin_zero[4] = 0x80;
                            sin.sin_zero[5] = '\0';
                            sin.sin_zero[6] = '\0';
                            sin.sin_zero[7] = '\0';
                            local_1af1 = (*eachresult)(resultsp,sin.sin_zero,
                                                       *(undefined8 *)
                                                        &fdlist[outlen_pmap._4_4_].proto);
                          }
                          else {
                            p = uaddr2taddr(*(netconfig **)&fdlist[outlen_pmap._4_4_].proto,
                                            (char *)&uaddrp);
                            local_1af1 = (*eachresult)(resultsp,p,
                                                       *(undefined8 *)
                                                        &fdlist[outlen_pmap._4_4_].proto);
                            mem_free(p,0);
                          }
                        }
                        msg.ru.RM_rmb.ru._0_8_ = xdr_void;
                        xdr_nreplymsg((XDR *)(msg.rq_cred_body + 0x188),(rpc_msg *)&ts.tv_nsec);
                        (*xresults)((XDR *)(msg.rq_cred_body + 0x188),resultsp);
                        if (*(long *)(msg.rq_cred_body._392_8_ + 0x30) != 0) {
                          (**(code **)(msg.rq_cred_body._392_8_ + 0x30))(msg.rq_cred_body + 0x188);
                        }
                        if (local_1af1 == false) goto LAB_0010c038;
                        fd = 0;
                        goto LAB_0010c57e;
                      }
                      piVar13 = __errno_location();
                    } while (*piVar13 == 4);
                    if ((__ntirpc_pkg_params.debug_flags & 0x1000) != 0) {
                      (*__ntirpc_pkg_params.warnx_)("clnt_bcast: Cannot receive reply to broadcast")
                      ;
                    }
                    fd = 4;
                  }
                  else {
                    pfd[(long)outlen_pmap._4_4_ + -1].fd = -1;
                    i = i + 1;
                  }
                }
LAB_0010c54f:
              }
            }
          }
        }
      }
      else {
        fd = 1;
      }
    }
  }
LAB_0010c57e:
  if (sys_auth != (AUTH *)0x0) {
    mem_free(sys_auth,(ulong)(uint)refs);
  }
  if (inbuf != (char *)0x0) {
    mem_free(inbuf,(ulong)(uint)refs);
  }
  if (barg_pmap._24_8_ != 0) {
    mem_free((void *)barg_pmap._24_8_,(ulong)stat);
  }
  for (outlen_pmap._4_4_ = 0; (xdrproc_t)(long)outlen_pmap._4_4_ < barg.xdr_args;
      outlen_pmap._4_4_ = outlen_pmap._4_4_ + 1) {
    close(*(int *)&fdlist[(long)outlen_pmap._4_4_ + -1].nal.tqh_last);
    __rpc_freebroadifs((broadlist_t *)&fdlist[outlen_pmap._4_4_].raddr.__ss_align);
  }
LAB_0010c648:
  uVar9 = auth_put(auth);
  if (uVar9 == 0) {
    (*auth->ah_ops->ah_destroy)(auth);
  }
  if ((__ntirpc_pkg_params.debug_flags & 0x80) != 0) {
    (*__ntirpc_pkg_params.warnx_)("%s: auth_put(), refs %d\n","rpc_broadcast_exp",(ulong)uVar9);
  }
  __rpc_endconf(vhandle);
  return fd;
}

Assistant:

enum clnt_stat
rpc_broadcast_exp(rpcprog_t prog,	/* program number */
		  rpcvers_t vers,	/* version number */
		  rpcproc_t proc,	/* procedure number */
		  xdrproc_t xargs,	/* xdr routine for args */
		  void *argsp,	/* pointer to args */
		  xdrproc_t xresults,	/* xdr routine for results */
		  void *resultsp,	/* pointer to results */
		  resultproc_t eachresult, /* call with each result obtained */
		  int inittime,	/* how long to wait initially */
		  int waittime,	/* maximum time to wait */
		  const char *nettype /* transport type */)
{
	XDR xdrs[1];
	struct rpc_msg msg;	/* RPC message */
	struct timespec ts;
	char *outbuf = NULL;	/* Broadcast msg buffer */
	char *inbuf = NULL;	/* Reply buf */
	AUTH *sys_auth = authunix_ncreate_default();
	void *handle;
	struct netconfig *nconf;
	char uaddress[1024];	/* A self imposed limit */
	char *uaddrp = uaddress;
	int pmap_reply_flag;	/* reply recvd from PORTMAP */
	/* An array of all the suitable broadcast transports */
	struct {
		int fd;		/* File descriptor */
		int af;
		int proto;
		struct netconfig *nconf;	/* Netconfig structure */
		u_int asize;	/* Size of the addr buf */
		u_int dsize;	/* Size of the data buf */
		struct sockaddr_storage raddr;	/* Remote address */
		broadlist_t nal;
	} fdlist[MAXBCAST];
	struct pollfd pfd[MAXBCAST];
	size_t fdlistno = 0;
	struct r_rpcb_rmtcallargs barg;	/* Remote arguments */
	struct r_rpcb_rmtcallres bres;	/* Remote results */
	size_t outlen;
	int msec;
	int pollretval;
	int fds_found;
	int inlen;
	int i;
#ifdef PORTMAP
	size_t outlen_pmap = 0;
	int pmap_flag = 0;	/* UDP exists ? */
	char *outbuf_pmap = NULL;
	struct rmtcallargs barg_pmap;	/* Remote arguments */
	struct rmtcallres bres_pmap;	/* Remote results */
	u_int udpbufsz = 0;
#endif				/* PORTMAP */
	u_int maxbufsize = 0;
	enum clnt_stat stat = RPC_SUCCESS;	/* Return status */

	stat = sys_auth->ah_error.re_status;
	if (stat) {
		AUTH_DESTROY(sys_auth);
		return (stat);
	}

	/*
	 * initialization: create a fd, a broadcast address, and send the
	 * request on the broadcast transport.
	 * Listen on all of them and on replies, call the user supplied
	 * function.
	 */

	if (nettype == NULL)
		nettype = "datagram_n";
	handle = __rpc_setconf(nettype);
	if (handle == NULL) {
		stat = RPC_UNKNOWNPROTO;
		goto cleanup;
	}
	while ((nconf = __rpc_getconf(handle)) != NULL) {
		int fd;
		struct __rpc_sockinfo si;

		if (nconf->nc_semantics != NC_TPI_CLTS)
			continue;
		if (fdlistno >= MAXBCAST)
			break;	/* No more slots available */
		if (!__rpc_nconf2sockinfo(nconf, &si))
			continue;

		TAILQ_INIT(&fdlist[fdlistno].nal);
		if (__rpc_getbroadifs
		    (si.si_af, si.si_proto, si.si_socktype,
		     &fdlist[fdlistno].nal) == 0)
			continue;

		fd = socket(si.si_af, si.si_socktype, si.si_proto);
		if (fd < 0) {
			stat = RPC_CANTSEND;
			continue;
		}
		fdlist[fdlistno].af = si.si_af;
		fdlist[fdlistno].proto = si.si_proto;
		fdlist[fdlistno].fd = fd;
		fdlist[fdlistno].nconf = nconf;
		fdlist[fdlistno].asize = __rpc_get_a_size(si.si_af);
		pfd[fdlistno].events =
		    POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND;
		pfd[fdlistno].fd = fdlist[fdlistno].fd = fd;
		fdlist[fdlistno].dsize =
		    __rpc_get_t_size(si.si_af, si.si_proto, 0);

		if (maxbufsize <= fdlist[fdlistno].dsize)
			maxbufsize = fdlist[fdlistno].dsize;

#ifdef PORTMAP
		if (si.si_af == AF_INET && si.si_proto == IPPROTO_UDP) {
			if (udpbufsz < fdlist[fdlistno].dsize)
				udpbufsz = fdlist[fdlistno].dsize;
			pmap_flag = 1;
		}
#endif				/* PORTMAP */
		fdlistno++;
	}

	if (fdlistno == 0) {
		if (stat == RPC_SUCCESS)
			stat = RPC_UNKNOWNPROTO;
		goto done_broad;
	}
	if (maxbufsize == 0) {
		if (stat == RPC_SUCCESS)
			stat = RPC_CANTSEND;
		goto done_broad;
	}
	inbuf = mem_alloc(maxbufsize);
	outbuf = mem_alloc(maxbufsize);
	if ((inbuf == NULL) || (outbuf == NULL)) {
		stat = RPC_SYSTEMERROR;
		goto done_broad;
	}

	/* Serialize all the arguments which have to be sent */
	(void)clock_gettime(CLOCK_MONOTONIC_FAST, &ts);
	msg.rm_xid = __RPC_GETXID(&ts);
	msg.rm_direction = CALL;
	msg.rm_call.cb_rpcvers = RPC_MSG_VERSION;
	msg.cb_prog = RPCBPROG;
	msg.cb_vers = RPCBVERS;
	msg.cb_proc = RPCBPROC_CALLIT;
	barg.prog = prog;
	barg.vers = vers;
	barg.proc = proc;
	barg.args.args_val = argsp;
	barg.xdr_args = xargs;
	bres.addr = uaddrp;
	bres.results.results_val = resultsp;
	bres.xdr_res = xresults;
	msg.cb_cred = sys_auth->ah_cred;
	msg.cb_verf = sys_auth->ah_verf;
	xdrmem_create(xdrs, outbuf, maxbufsize, XDR_ENCODE);
	if ((!xdr_callmsg(xdrs, &msg))
	    ||
	    (!xdr_rpcb_rmtcallargs
	     (xdrs, (struct rpcb_rmtcallargs *)(void *)&barg))) {
		stat = RPC_CANTENCODEARGS;
		goto done_broad;
	}
	outlen = xdr_getpos(xdrs);
	xdr_destroy(xdrs);

#ifdef PORTMAP
	/* Prepare the packet for version 2 PORTMAP */
	if (pmap_flag) {
		outbuf_pmap = mem_alloc(udpbufsz);
		if (outbuf_pmap == NULL) {
			stat = RPC_SYSTEMERROR;
			goto done_broad;
		}
		msg.rm_xid++;	/* One way to distinguish */
		msg.cb_prog = PMAPPROG;
		msg.cb_vers = PMAPVERS;
		msg.cb_proc = PMAPPROC_CALLIT;
		barg_pmap.prog = prog;
		barg_pmap.vers = vers;
		barg_pmap.proc = proc;
		barg_pmap.args_ptr = argsp;
		barg_pmap.xdr_args = xargs;
		bres_pmap.xdr_results = xresults;
		bres_pmap.results_ptr = resultsp;
		xdrmem_create(xdrs, outbuf_pmap, udpbufsz, XDR_ENCODE);
		if ((!xdr_callmsg(xdrs, &msg))
		    || (!xdr_rmtcall_args(xdrs, &barg_pmap))) {
			stat = RPC_CANTENCODEARGS;
			goto done_broad;
		}
		outlen_pmap = xdr_getpos(xdrs);
		xdr_destroy(xdrs);
	}
#endif				/* PORTMAP */

	/*
	 * Basic loop: broadcast the packets to transports which
	 * support data packets of size such that one can encode
	 * all the arguments.
	 * Wait a while for response(s).
	 * The response timeout grows larger per iteration.
	 */
	for (msec = inittime; msec <= waittime; msec += msec) {
		struct broadif *bip;

		/* Broadcast all the packets now */
		for (i = 0; i < fdlistno; i++) {
			if (fdlist[i].dsize < outlen) {
				stat = RPC_CANTSEND;
				continue;
			}
			for (bip = TAILQ_FIRST(&fdlist[i].nal); bip != NULL;
			     bip = TAILQ_NEXT(bip, link)) {
				void *addr;

				addr = &bip->broadaddr;

				__rpc_broadenable(fdlist[i].af, fdlist[i].fd,
						  bip);

				/*
				 * Only use version 3 if lowvers is not set
				 */

				if (!__rpc_lowvers)
					if (sendto
					    (fdlist[i].fd, outbuf, outlen, 0,
					     (struct sockaddr *)addr,
					     (size_t) fdlist[i].asize) !=
					    outlen) {
#ifdef RPC_DEBUG
						perror("sendto");
#endif
						__warnx
						   (TIRPC_DEBUG_FLAG_CLNT_BCAST,
						    "clnt_bcast: cannot send "
						    "broadcast packet");
						stat = RPC_CANTSEND;
						continue;
					};
#ifdef RPC_DEBUG
				if (!__rpc_lowvers)
					fprintf(stderr,
						"Broadcast packet sent "
						"for %s\n",
						fdlist[i].nconf->nc_netid);
#endif
#ifdef PORTMAP
				/*
				 * Send the version 2 packet also
				 * for UDP/IP
				 */
				if (pmap_flag && fdlist[i].proto
				    == IPPROTO_UDP) {
					if (sendto
					    (fdlist[i].fd, outbuf_pmap,
					     outlen_pmap, 0, addr,
					     (size_t) fdlist[i].asize) !=
					    outlen_pmap) {
						__warnx
						   (TIRPC_DEBUG_FLAG_CLNT_BCAST,
						    "clnt_bcast: Cannot send "
						    "broadcast packet");
						stat = RPC_CANTSEND;
						continue;
					}
				}
#ifdef RPC_DEBUG
				fprintf(stderr,
					"PMAP Broadcast packet "
					"sent for %s\n",
					fdlist[i].nconf->nc_netid);
#endif
#endif				/* PORTMAP */
			}
			/* End for sending all packets on this transport */
		}		/* End for sending on all transports */

		if (eachresult == NULL) {
			stat = RPC_SUCCESS;
			goto done_broad;
		}

		/*
		 * Get all the replies from these broadcast requests
		 */
 recv_again:

		switch (pollretval = poll(pfd, fdlistno, msec)) {
		case 0:	/* timed out */
			stat = RPC_TIMEDOUT;
			continue;
		case -1:	/* some kind of error - we ignore it */
			goto recv_again;
		}		/* end of poll results switch */

		for (i = fds_found = 0; i < fdlistno && fds_found < pollretval;
		     i++) {
			bool done = false;

			if (pfd[i].revents == 0)
				continue;
			else if (pfd[i].revents & POLLNVAL) {
				/*
				 * Something bad has happened to this descri-
				 * ptor. We can cause _poll() to ignore
				 * it simply by using a negative fd.  We do that
				 * rather than compacting the pfd[] and fdlist[]
				 * arrays.
				 */
				pfd[i].fd = -1;
				fds_found++;
				continue;
			} else
				fds_found++;
#ifdef RPC_DEBUG
			fprintf(stderr, "response for %s\n",
				fdlist[i].nconf->nc_netid);
#endif
 try_again:
			inlen =
			    recvfrom(fdlist[i].fd, inbuf, fdlist[i].dsize, 0,
				     (struct sockaddr *)(void *)
				     &fdlist[i].raddr, &fdlist[i].asize);
			if (inlen < 0) {
				if (errno == EINTR)
					goto try_again;
				__warnx(TIRPC_DEBUG_FLAG_CLNT_BCAST,
					"clnt_bcast: Cannot receive reply to broadcast");
				stat = RPC_CANTRECV;
				continue;
			}
			if (inlen < sizeof(u_int32_t))
				continue;	/* Drop that and go ahead */
			/*
			 * see if reply transaction id matches sent id.
			 * If so, decode the results. If return id is xid + 1
			 * it was a PORTMAP reply
			 */
			if (*((u_int32_t *) (void *)(inbuf)) ==
			    *((u_int32_t *) (void *)(outbuf))) {
				pmap_reply_flag = 0;
				msg.RPCM_ack.ar_verf = _null_auth;
				msg.RPCM_ack.ar_results.where =
				    &bres;
				msg.RPCM_ack.ar_results.proc =
				    (xdrproc_t) xdr_rpcb_rmtcallres;
#ifdef PORTMAP
			} else if (pmap_flag
				   && *((u_int32_t *) (void *)(inbuf)) ==
				   *((u_int32_t *) (void *)(outbuf_pmap))) {
				pmap_reply_flag = 1;
				msg.RPCM_ack.ar_verf = _null_auth;
				msg.RPCM_ack.ar_results.where =
				    &bres_pmap;
				msg.RPCM_ack.ar_results.proc =
				    (xdrproc_t) xdr_rmtcallres;
#endif				/* PORTMAP */
			} else
				continue;
			xdrmem_create(xdrs, inbuf, (u_int) inlen, XDR_DECODE);
			if (xdr_replymsg(xdrs, &msg)) {
				if ((msg.rm_reply.rp_stat == MSG_ACCEPTED)
				    && (msg.RPCM_ack.ar_stat == SUCCESS)) {
					struct netbuf *np;
#ifdef PORTMAP
					struct netbuf taddr;
					struct sockaddr_in sin;

					if (pmap_flag && pmap_reply_flag) {
						memcpy(&sin, &fdlist[i].raddr,
						       sizeof(sin));
						sin.sin_port =
						    htons(bres_pmap.port);
						memcpy(&fdlist[i].raddr, &sin,
						       sizeof(sin));
						taddr.len = taddr.maxlen =
						    sizeof(fdlist[i].raddr);
						taddr.buf = &fdlist[i].raddr;
						done =
						    (*eachresult) (resultsp,
								   &taddr,
								   fdlist[i].
								   nconf);
					} else {
#endif				/* PORTMAP */
#ifdef RPC_DEBUG
						fprintf(stderr, "uaddr %s\n",
							uaddrp);
#endif
						np = uaddr2taddr(fdlist[i].
								 nconf, uaddrp);
						done =
						    (*eachresult) (resultsp, np,
								   fdlist[i].
								   nconf);
						mem_free(np, 0);
#ifdef PORTMAP
					}
#endif				/* PORTMAP */
				}
				/* otherwise, we just ignore the errors ... */
			}
			/* else some kind of deserialization problem ... */

			xdrs->x_op = XDR_FREE;
			msg.RPCM_ack.ar_results.proc = (xdrproc_t) xdr_void;
			(void)xdr_replymsg(xdrs, &msg);
			(void)(*xresults) (xdrs, resultsp);
			XDR_DESTROY(xdrs);
			if (done) {
				stat = RPC_SUCCESS;
				goto done_broad;
			} else {
				goto recv_again;
			}
		}		/* The recv for loop */
	}			/* The giant for loop */

 done_broad:
	if (inbuf)
		mem_free(inbuf, maxbufsize);
	if (outbuf)
		mem_free(outbuf, maxbufsize);
#ifdef PORTMAP
	if (outbuf_pmap)
		mem_free(outbuf_pmap, udpbufsz);
#endif				/* PORTMAP */
	for (i = 0; i < fdlistno; i++) {
		(void)close(fdlist[i].fd);
		__rpc_freebroadifs(&fdlist[i].nal);
	}
 cleanup:
	AUTH_DESTROY(sys_auth);
	(void)__rpc_endconf(handle);

	return (stat);
}